

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O1

int tc_uECC_valid_point(tc_uECC_word_t *point,tc_uECC_Curve curve)

{
  tc_uECC_word_t *left;
  byte num_words;
  uint uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  tc_uECC_word_t local_88 [2];
  tc_uECC_word_t tmp2 [8];
  uint uStack_4c;
  tc_uECC_word_t local_48 [2];
  tc_uECC_word_t tmp1 [8];
  
  num_words = curve->num_words;
  uVar5 = (uint)num_words;
  if ((char)(num_words * '\x02') < '\x01') {
    return -1;
  }
  uVar7 = 0;
  uVar8 = 0;
  do {
    uVar8 = uVar8 | point[uVar7];
    uVar7 = uVar7 + 1;
  } while ((byte)(num_words * '\x02') != uVar7);
  uVar6 = uVar5;
  if (uVar8 != 0) {
    while( true ) {
      uVar6 = uVar6 - 1;
      if ((char)uVar6 < '\0') {
        return -2;
      }
      uVar7 = (ulong)((uVar6 & 0x7f) << 2);
      uVar8 = *(uint *)((long)curve->p + uVar7);
      uVar1 = *(uint *)((long)point + uVar7);
      if (uVar1 < uVar8) break;
      if (uVar8 < uVar1) {
        return -2;
      }
    }
    left = point + (char)num_words;
    while( true ) {
      uVar5 = uVar5 - 1;
      if ((char)uVar5 < '\0') {
        return -2;
      }
      uVar7 = (ulong)((uVar5 & 0x7f) << 2);
      uVar8 = *(uint *)((long)curve->p + uVar7);
      uVar6 = *(uint *)((long)left + uVar7);
      if (uVar6 < uVar8) break;
      if (uVar8 < uVar6) {
        return -2;
      }
    }
    tc_uECC_vli_mult(local_88,left,left,num_words);
    (*curve->mmod_fast)(local_48,local_88);
    (*curve->x_side)(local_88,point,curve);
    if ((char)(num_words - 1) < '\0') {
      return 0;
    }
    uVar5 = 0;
    lVar3 = (ulong)(byte)(num_words - 1) + 1;
    do {
      uVar5 = uVar5 | local_88[lVar3 + -1] ^ (&uStack_4c)[lVar3];
      lVar4 = lVar3 + -1;
      bVar2 = 0 < lVar3;
      lVar3 = lVar4;
    } while (lVar4 != 0 && bVar2);
    return (uint)(uVar5 == 0) * 3 + -3;
  }
  return -1;
}

Assistant:

int tc_uECC_valid_point(const tc_uECC_word_t *point, tc_uECC_Curve curve)
{
	tc_uECC_word_t tmp1[NUM_ECC_WORDS];
	tc_uECC_word_t tmp2[NUM_ECC_WORDS];
	wordcount_t num_words = curve->num_words;

	/* The point at infinity is invalid. */
	if (EccPoint_isZero(point, curve)) {
		return -1;
	}

	/* x and y must be smaller than p. */
	if (tc_uECC_vli_cmp_unsafe(curve->p, point, num_words) != 1 ||
		tc_uECC_vli_cmp_unsafe(curve->p, point + num_words, num_words) != 1) {
		return -2;
	}

	tc_uECC_vli_modSquare_fast(tmp1, point + num_words, curve);
	curve->x_side(tmp2, point, curve); /* tmp2 = x^3 + ax + b */

	/* Make sure that y^2 == x^3 + ax + b */
	if (tc_uECC_vli_equal(tmp1, tmp2, num_words) != 0)
		return -3;

	return 0;
}